

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

int CompareXform(ON_Xform *a,ON_Xform *b)

{
  double dVar1;
  double dVar2;
  long lVar3;
  int iVar4;
  double *db;
  double *da;
  
  lVar3 = 0;
  while( true ) {
    dVar1 = a->m_xform[0][lVar3];
    dVar2 = b->m_xform[0][lVar3];
    if (dVar1 < dVar2) {
      return -1;
    }
    if (dVar2 < dVar1) {
      return 1;
    }
    if ((dVar1 != dVar2) || (iVar4 = 0, NAN(dVar1) || NAN(dVar2))) {
      if (NAN(dVar1)) {
        iVar4 = -(uint)!NAN(dVar2);
      }
      else {
        iVar4 = 0;
        if (NAN(dVar2)) {
          return -1;
        }
      }
    }
    if ((int)lVar3 == 0xf) break;
    lVar3 = lVar3 + 1;
    if (iVar4 != 0) {
      return iVar4;
    }
  }
  return iVar4;
}

Assistant:

static int CompareXform( const ON_Xform& a, const ON_Xform& b )
{
  int i,j;
  const double* da = &a.m_xform[0][0];
  const double* db = &b.m_xform[0][0];
  i = 16;
  j = 0;
  while ( i-- && !j)
  {
    j = CompareDouble(*da++,*db++);
  }

  return j;
}